

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

Type * __thiscall
soul::AST::Expression::resolveAsType(Type *__return_storage_ptr__,Expression *this)

{
  CompileMessage CStack_48;
  
  CompileMessageHelpers::createMessage<>(&CStack_48,syntax,error,"Expected a type");
  Context::throwError(&(this->super_Statement).super_ASTObject.context,&CStack_48,false);
}

Assistant:

virtual Type resolveAsType() const                            { context.throwError (Errors::expectedType()); }